

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O0

void __thiscall
Encapsulation_parseAlternateFormHierarchy_Test::Encapsulation_parseAlternateFormHierarchy_Test
          (Encapsulation_parseAlternateFormHierarchy_Test *this)

{
  Encapsulation_parseAlternateFormHierarchy_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Encapsulation_parseAlternateFormHierarchy_Test_0013aa00;
  return;
}

Assistant:

TEST(Encapsulation, parseAlternateFormHierarchy)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\">\n"
        "        <component_ref component=\"child2\">\n"
        "          <component_ref component=\"child3\"/>\n"
        "        </component_ref>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child3\"/>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());
    EXPECT_EQ(size_t(1), model->componentCount());
    auto component = model->component(0);
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(size_t(1), component->componentCount());
        component = component->component(0);
    }
    EXPECT_EQ(size_t(0), component->componentCount());
}